

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

exr_result_t validate_tile_data(_internal_exr_context *f,_internal_exr_part *curpart)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  exr_attr_tiledesc_t *peVar6;
  exr_attr_chlist_t *peVar7;
  exr_attr_chlist_entry_t *peVar8;
  exr_result_t eVar9;
  long lVar10;
  ulong uVar11;
  undefined8 uVar12;
  char *pcVar13;
  long lVar14;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  if ((curpart->storage_mode | EXR_STORAGE_DEEP_SCANLINE) != EXR_STORAGE_DEEP_TILED) {
    return 0;
  }
  if (curpart->tiles == (exr_attribute_t *)0x0) {
    eVar9 = (*f->print_error)(f,0xd,"\'tiles\' attribute for tiled file not found",f->print_error);
    return eVar9;
  }
  peVar6 = (curpart->tiles->field_6).tiledesc;
  uVar2 = peVar6->x_size;
  uVar3 = peVar6->y_size;
  if ((uVar2 == 0) || (0x1fffffff < uVar2 || uVar3 + 0xe0000000 < 0xe0000001)) {
    UNRECOVERED_JUMPTABLE = f->print_error;
    pcVar13 = "Invalid tile description size (%u x %u)";
    uVar4 = uVar3;
  }
  else {
    uVar4 = f->max_tile_w;
    uVar5 = f->max_tile_h;
    peVar7 = (curpart->channels->field_6).chlist;
    bVar1 = peVar6->level_and_round;
    if (((int)uVar4 < 1) || ((int)uVar2 <= (int)uVar4)) {
      if ((0 < (int)uVar5) && (uVar5 < uVar3)) {
        eVar9 = (*f->print_error)(f,0xe,"Width of tile exceeds max size (%d vs max %d)",(ulong)uVar3
                                  ,(ulong)uVar5);
        return eVar9;
      }
      uVar11 = (ulong)(bVar1 & 0xf);
      if ((bVar1 & 0xf) < 3) {
        if (bVar1 < 0x20) {
          lVar10 = (long)peVar7->num_channels;
          if (lVar10 < 1) {
            return 0;
          }
          peVar8 = peVar7->entries;
          lVar14 = 0;
          do {
            uVar2 = *(uint *)(peVar8->reserved + lVar14 + 3);
            if (uVar2 != 1) {
              UNRECOVERED_JUMPTABLE = f->print_error;
              uVar12 = *(undefined8 *)(peVar8->reserved + lVar14 + -0xd);
              pcVar13 = "channel \'%s\': x subsampling factor is not 1 (%d) for a tiled image";
LAB_00128e0d:
              eVar9 = (*UNRECOVERED_JUMPTABLE)
                                (f,0xe,pcVar13,uVar12,(ulong)uVar2,UNRECOVERED_JUMPTABLE);
              return eVar9;
            }
            uVar2 = *(uint *)(peVar8->reserved + lVar14 + 7);
            if (uVar2 != 1) {
              UNRECOVERED_JUMPTABLE = f->print_error;
              uVar12 = *(undefined8 *)(peVar8->reserved + lVar14 + -0xd);
              pcVar13 = "channel \'%s\': y subsampling factor is not 1 (%d) for a tiled image";
              goto LAB_00128e0d;
            }
            lVar14 = lVar14 + 0x20;
            if (lVar10 * 0x20 == lVar14) {
              return 0;
            }
          } while( true );
        }
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar13 = "Invalid rounding mode (%d) in tile description header";
        uVar11 = (ulong)(bVar1 >> 4);
      }
      else {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar13 = "Invalid level mode (%d) in tile description header";
      }
      eVar9 = (*UNRECOVERED_JUMPTABLE)(f,0xe,pcVar13,uVar11,UNRECOVERED_JUMPTABLE);
      return eVar9;
    }
    UNRECOVERED_JUMPTABLE = f->print_error;
    pcVar13 = "Width of tile exceeds max size (%d vs max %d)";
  }
  eVar9 = (*UNRECOVERED_JUMPTABLE)(f,0xe,pcVar13,(ulong)uVar2,(ulong)uVar4,UNRECOVERED_JUMPTABLE);
  return eVar9;
}

Assistant:

static exr_result_t
validate_tile_data (
    struct _internal_exr_context* f, struct _internal_exr_part* curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_TILED ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_tiledesc_t* desc;
        const int                  maxtilew = f->max_tile_w;
        const int                  maxtileh = f->max_tile_h;
        const exr_attr_chlist_t*   channels = curpart->channels->chlist;
        exr_tile_level_mode_t      levmode;
        exr_tile_round_mode_t      rndmode;

        if (!curpart->tiles)
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'tiles' attribute for tiled file not found");

        desc    = curpart->tiles->tiledesc;
        levmode = EXR_GET_TILE_LEVEL_MODE (*desc);
        rndmode = EXR_GET_TILE_ROUND_MODE (*desc);

        if (desc->x_size == 0 || desc->y_size == 0 ||
            desc->x_size > (uint32_t) (INT_MAX / 4) ||
            desc->y_size > (uint32_t) (INT_MAX / 4))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid tile description size (%u x %u)",
                desc->x_size,
                desc->y_size);
        if (maxtilew > 0 && maxtilew < (int) (desc->x_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->x_size,
                maxtilew);
        if (maxtileh > 0 && maxtileh < (int) (desc->y_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->y_size,
                maxtileh);

        if ((int) levmode < EXR_TILE_ONE_LEVEL ||
            (int) levmode >= EXR_TILE_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid level mode (%d) in tile description header",
                (int) levmode);

        if ((int) rndmode < EXR_TILE_ROUND_DOWN ||
            (int) rndmode >= EXR_TILE_ROUND_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid rounding mode (%d) in tile description header",
                (int) rndmode);

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}